

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x3.c
# Opt level: O0

void convolve(uint8_t *x,uint8_t *y,int sz,uint8_t *k,int ksz)

{
  int local_40;
  int local_3c;
  int i_2;
  int j;
  uint32_t acc;
  int i_1;
  int i;
  int ksz_local;
  uint8_t *k_local;
  int sz_local;
  uint8_t *y_local;
  uint8_t *x_local;
  
  if ((ksz & 1U) == 1) {
    for (acc = 0; (int)acc < ksz / 2 && (int)acc < sz; acc = acc + 1) {
      y[(int)acc] = x[(int)acc];
    }
    for (j = 0; j < sz - ksz; j = j + 1) {
      i_2 = 0;
      for (local_3c = 0; local_3c < ksz; local_3c = local_3c + 1) {
        i_2 = (uint)k[local_3c] * (uint)x[j + local_3c] + i_2;
      }
      y[ksz / 2 + j] = (uint8_t)((uint)i_2 >> 8);
    }
    for (local_40 = (sz - ksz) + ksz / 2; local_40 < sz; local_40 = local_40 + 1) {
      y[local_40] = x[local_40];
    }
    return;
  }
  __assert_fail("(ksz&1)==1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x3.c"
                ,0xbb,"void convolve(const uint8_t *, uint8_t *, int, const uint8_t *, int)");
}

Assistant:

static void convolve(const uint8_t *x, uint8_t *y, int sz, const uint8_t *k, int ksz)
{
    assert((ksz&1)==1);

    for (int i = 0; i < ksz/2 && i < sz; i++)
        y[i] = x[i];

    for (int i = 0; i < sz - ksz; i++) {
        uint32_t acc = 0;

        for (int j = 0; j < ksz; j++)
            acc += k[j]*x[i+j];

        y[ksz/2 + i] = acc >> 8;
    }

    for (int i = sz - ksz + ksz/2; i < sz; i++)
        y[i] = x[i];
}